

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void P_MarkWorldVarStrings(void)

{
  long lVar1;
  
  ACSStringPool::MarkStringArray(&GlobalACSStrings,ACS_WorldVars,0x100);
  for (lVar1 = 0; lVar1 != 0x1800; lVar1 = lVar1 + 0x18) {
    ACSStringPool::MarkStringMap
              (&GlobalACSStrings,(FWorldGlobalArray *)((long)&ACS_WorldArrays[0].Nodes + lVar1));
  }
  return;
}

Assistant:

void P_MarkWorldVarStrings()
{
	GlobalACSStrings.MarkStringArray(ACS_WorldVars, countof(ACS_WorldVars));
	for (size_t i = 0; i < countof(ACS_WorldArrays); ++i)
	{
		GlobalACSStrings.MarkStringMap(ACS_WorldArrays[i]);
	}
}